

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O3

ResourceBundle * __thiscall
icu_63::ResourceBundle::getNext
          (ResourceBundle *__return_storage_ptr__,ResourceBundle *this,UErrorCode *status)

{
  UResourceBundle r;
  UResourceBundle UStack_e8;
  
  ures_initStackObject_63(&UStack_e8);
  ures_getNextResource_63(this->fResource,&UStack_e8,status);
  ResourceBundle(__return_storage_ptr__,&UStack_e8,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    ures_close_63(&UStack_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

ResourceBundle ResourceBundle::getNext(UErrorCode& status) {
    UResourceBundle r;

    ures_initStackObject(&r);
    ures_getNextResource(fResource, &r, &status);
    ResourceBundle res(&r, status);
    if (U_SUCCESS(status)) {
        ures_close(&r);
    }
    return res;
}